

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O0

void __thiscall Sparse_matrix_Construct(void *this,uint size,uint nzcount)

{
  void *pvVar1;
  uint nzcount_local;
  uint size_local;
  Sparse_matrix *this_local;
  
  *(uint *)this = size;
  pvVar1 = malloc((ulong)(size + nzcount + 1) << 2);
  *(void **)((long)this + 8) = pvVar1;
  pvVar1 = malloc((ulong)(size + nzcount + 1) << 3);
  *(void **)((long)this + 0x10) = pvVar1;
  Sparse_matrix_Clear(this);
  return;
}

Assistant:

void Sparse_matrix_Construct (
    Sparse_matrix * this,
    unsigned size,
    unsigned nzcount) {

  this->size = size;
  this->indices = NEW(unsigned, size + nzcount + 1);
  this->elements = NEW(double, size + nzcount + 1);

  Sparse_matrix_Clear (this);
}